

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rexo.h
# Opt level: O0

void rx__int_assess_comparison
               (rx_context *context,rx__int x1,rx__int x2,rx__op op,char *expr1,char *expr2,
               char *file,int line,rx_severity severity,char *failure_fmt,...)

{
  char in_AL;
  rx_status rVar1;
  undefined8 in_XMM0_Qa;
  undefined8 in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  undefined8 in_XMM3_Qa;
  undefined8 in_XMM4_Qa;
  undefined8 in_XMM5_Qa;
  undefined8 in_XMM6_Qa;
  undefined8 in_XMM7_Qa;
  undefined1 local_148 [48];
  undefined8 local_118;
  undefined8 local_108;
  undefined8 local_f8;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  undefined8 local_b8;
  undefined8 local_a8;
  size_t local_98;
  size_t rx__length_2;
  size_t rx__length_1;
  va_list args;
  size_t rx__length;
  char *op_name;
  char *op_symbol;
  char *pcStack_50;
  rx_status status;
  char *diagnostic_msg;
  char *failure_msg;
  char *pcStack_38;
  int result;
  char *expr2_local;
  char *expr1_local;
  rx__int rStack_20;
  rx__op op_local;
  rx__int x2_local;
  rx__int x1_local;
  rx_context *context_local;
  
  if (in_AL != '\0') {
    local_118 = in_XMM0_Qa;
    local_108 = in_XMM1_Qa;
    local_f8 = in_XMM2_Qa;
    local_e8 = in_XMM3_Qa;
    local_d8 = in_XMM4_Qa;
    local_c8 = in_XMM5_Qa;
    local_b8 = in_XMM6_Qa;
    local_a8 = in_XMM7_Qa;
  }
  pcStack_38 = expr2;
  expr2_local = expr1;
  expr1_local._4_4_ = op;
  rStack_20 = x2;
  x2_local = x1;
  x1_local = (rx__int)context;
  if (context == (rx_context *)0x0) {
    __assert_fail("context != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159c,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (expr1 == (char *)0x0) {
    __assert_fail("expr1 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159d,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (expr2 == (char *)0x0) {
    __assert_fail("expr2 != NULL",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x159e,
                  "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                 );
  }
  if (file != (char *)0x0) {
    switch(op) {
    case RX__OP_EQUAL:
      failure_msg._4_4_ = (uint)(x1 == x2);
      break;
    case RX__OP_NOT_EQUAL:
      failure_msg._4_4_ = (uint)(x1 != x2);
      break;
    case RX__OP_GREATER:
      failure_msg._4_4_ = (uint)(x2 < x1);
      break;
    case RX__OP_LESSER:
      failure_msg._4_4_ = (uint)(x1 < x2);
      break;
    case RX__OP_GREATER_OR_EQUAL:
      failure_msg._4_4_ = (uint)(x2 <= x1);
      break;
    case RX__OP_LESSER_OR_EQUAL:
      failure_msg._4_4_ = (uint)(x1 <= x2);
      break;
    default:
      __assert_fail("0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                    ,0x15b5,
                    "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
                   );
    }
    if (failure_msg._4_4_ == 0) {
      if (failure_fmt == (char *)0x0) {
        rx__op_get_name((char **)&rx__length,op);
        diagnostic_msg = (char *)0x0;
        op_symbol._4_4_ =
             rx__str_initialize((size_t *)&args[0].reg_save_area,(char *)0x0,
                                "`%s` is expected to be %s `%s`",expr2_local,rx__length,pcStack_38);
        if (op_symbol._4_4_ == RX_SUCCESS) {
          diagnostic_msg = (char *)malloc((size_t)args[0].reg_save_area);
          if (diagnostic_msg == (char *)0x0) {
            rx__log(RX_LOG_LEVEL_ALL,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                    ,0x15ca,"failed to allocate the string (%lu bytes)\n",args[0].reg_save_area);
            op_symbol._4_4_ = RX_ERROR_ALLOCATION;
          }
          else {
            op_symbol._4_4_ =
                 rx__str_initialize((size_t *)&args[0].reg_save_area,diagnostic_msg,
                                    "`%s` is expected to be %s `%s`",expr2_local,rx__length,
                                    pcStack_38);
            if (op_symbol._4_4_ != RX_SUCCESS) {
              free(diagnostic_msg);
            }
          }
        }
      }
      else {
        diagnostic_msg = (char *)0x0;
        args[0].overflow_arg_area = local_148;
        args[0]._0_8_ = &stack0x00000028;
        rx__length_1._4_4_ = 0x30;
        rx__length_1._0_4_ = 0x30;
        op_symbol._4_4_ =
             rx__str_initialize_va_list
                       (&rx__length_2,(char *)0x0,failure_fmt,(__va_list_tag *)&rx__length_1);
        if (op_symbol._4_4_ == RX_SUCCESS) {
          diagnostic_msg = (char *)malloc(rx__length_2);
          if (diagnostic_msg == (char *)0x0) {
            rx__log(RX_LOG_LEVEL_ALL,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                    ,0x15cc,"failed to allocate the string (%lu bytes)\n",rx__length_2);
            op_symbol._4_4_ = RX_ERROR_ALLOCATION;
          }
          else {
            args[0].overflow_arg_area = local_148;
            args[0]._0_8_ = &stack0x00000028;
            rx__length_1._4_4_ = 0x30;
            rx__length_1._0_4_ = 0x30;
            op_symbol._4_4_ =
                 rx__str_initialize_va_list
                           (&rx__length_2,diagnostic_msg,failure_fmt,(__va_list_tag *)&rx__length_1)
            ;
            if (op_symbol._4_4_ != RX_SUCCESS) {
              free(diagnostic_msg);
            }
          }
        }
      }
      if (op_symbol._4_4_ != RX_SUCCESS) {
        rx__log(RX_LOG_LEVEL_ALL,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x15d3,
                "failed to create the failure message for the integer comparison test located at %s:%d\n"
                ,file,(ulong)(uint)line);
        diagnostic_msg = (char *)0x0;
      }
      rx__op_get_symbol(&op_name,expr1_local._4_4_);
      pcStack_50 = (char *)0x0;
      op_symbol._4_4_ =
           rx__str_initialize(&local_98,(char *)0x0,"%ld %s %ld",x2_local,op_name,rStack_20);
      if (op_symbol._4_4_ == RX_SUCCESS) {
        pcStack_50 = (char *)malloc(local_98);
        if (pcStack_50 == (char *)0x0) {
          rx__log(RX_LOG_LEVEL_ALL,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                  ,0x15dd,"failed to allocate the string (%lu bytes)\n",local_98);
          op_symbol._4_4_ = RX_ERROR_ALLOCATION;
        }
        else {
          op_symbol._4_4_ =
               rx__str_initialize(&local_98,pcStack_50,"%ld %s %ld",x2_local,op_name,rStack_20);
          if (op_symbol._4_4_ != RX_SUCCESS) {
            free(pcStack_50);
          }
        }
      }
      if (op_symbol._4_4_ != RX_SUCCESS) {
        rx__log(RX_LOG_LEVEL_ALL,
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x15e2,
                "failed to create the diagnostic message for the integer comparison test located at %s:%d\n"
                ,file,(ulong)(uint)line);
        pcStack_50 = (char *)0x0;
      }
    }
    else {
      diagnostic_msg = (char *)0x0;
      pcStack_50 = (char *)0x0;
    }
    rVar1 = rx_handle_test_result
                      ((rx_context *)x1_local,failure_msg._4_4_,file,line,severity,diagnostic_msg,
                       pcStack_50);
    if (rVar1 != RX_SUCCESS) {
      rx__log(RX_LOG_LEVEL_ALL,
              "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
              ,0x15ed,
              "failed to handle the test result for the integer comparison test located at %s:%d\n",
              file,(ulong)(uint)line);
    }
    free(diagnostic_msg);
    free(pcStack_50);
    if ((failure_msg._4_4_ == 0) && (severity == RX_FATAL)) {
      rx_abort((rx_context *)x1_local);
    }
    return;
  }
  __assert_fail("file != NULL",
                "/workspace/llm4binary/github/license_all_cmakelists_25/christophercrouzet[P]uuki/deps/rexo/include/rexo.h"
                ,0x159f,
                "void rx__int_assess_comparison(struct rx_context *, rx__int, rx__int, enum rx__op, const char *, const char *, const char *, int, enum rx_severity, const char *, ...)"
               );
}

Assistant:

static void
rx__int_assess_comparison(struct rx_context *context,
                          rx__int x1,
                          rx__int x2,
                          enum rx__op op,
                          const char *expr1,
                          const char *expr2,
                          const char *file,
                          int line,
                          enum rx_severity severity,
                          const char *failure_fmt,
                          ...)
{
    int result;
    char *failure_msg;
    char *diagnostic_msg;

    RX_ASSERT(context != NULL);
    RX_ASSERT(expr1 != NULL);
    RX_ASSERT(expr2 != NULL);
    RX_ASSERT(file != NULL);

    switch (op) {
        case RX__OP_EQUAL:
            result = x1 == x2;
            break;
        case RX__OP_NOT_EQUAL:
            result = x1 != x2;
            break;
        case RX__OP_GREATER:
            result = x1 > x2;
            break;
        case RX__OP_LESSER:
            result = x1 < x2;
            break;
        case RX__OP_GREATER_OR_EQUAL:
            result = x1 >= x2;
            break;
        case RX__OP_LESSER_OR_EQUAL:
            result = x1 <= x2;
            break;
        default:
            RX_ASSERT(0);
            result = 0;
            break;
    }

    if (result) {
        failure_msg = NULL;
        diagnostic_msg = NULL;
    } else {
        enum rx_status status;
        const char *op_symbol;

        if (failure_fmt == NULL) {
            const char *op_name;

            rx__op_get_name(&op_name, op);
            RX__STR_CREATE_3(status,
                             failure_msg,
                             "`%s` is expected to be %s `%s`",
                             expr1,
                             op_name,
                             expr2);
        } else {
            RX__STR_CREATE_VA_LIST(status, failure_msg, failure_fmt);
        }

        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the failure message for "
                            "the integer comparison test located at %s:%d\n",
                            file,
                            line);
            failure_msg = NULL;
        }

        rx__op_get_symbol(&op_symbol, op);
        RX__STR_CREATE_3(status,
                         diagnostic_msg,
                         "%ld %s %ld",
                         (long)x1,
                         op_symbol,
                         (long)x2);
        if (status != RX_SUCCESS) {
            RX__LOG_DEBUG_2("failed to create the diagnostic message for "
                            "the integer comparison test located at %s:%d\n",
                            file,
                            line);
            diagnostic_msg = NULL;
        }
    }

    if (rx_handle_test_result(
            context, result, file, line, severity, failure_msg, diagnostic_msg)
        != RX_SUCCESS) {
        RX__LOG_DEBUG_2("failed to handle the test result for the integer "
                        "comparison test located at %s:%d\n",
                        file,
                        line);
    }

    RX_FREE(failure_msg);
    RX_FREE(diagnostic_msg);

    if (!result && severity == RX_FATAL) {
        rx_abort(context);
    }
}